

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O2

int __thiscall
FNodeBuilder::OutputDegenerateSubsector
          (FNodeBuilder *this,TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> *segs,
          int subsector,bool bForward,double lastdot,FPrivSeg **prev,vertex_t *outVerts)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  subsector_t *psVar6;
  FPrivSeg *pFVar7;
  FPrivVert *pFVar8;
  DWORD DVar9;
  long lVar10;
  undefined7 in_register_00000009;
  FNodeBuilder *this_00;
  int iVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  FPrivSeg *seg;
  FPrivSeg *pFVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  psVar6 = (this->Subsectors).Array;
  pFVar7 = (this->Segs).Array;
  iVar13 = (int)psVar6[subsector].firstline;
  iVar11 = iVar13 + psVar6[subsector].numlines;
  uVar2 = (this->SegList).Array[iVar13].SegNum;
  this_00 = (FNodeBuilder *)(this->Vertices).Array;
  iVar3 = *(int *)(&this_00->VertexMap + (long)pFVar7[uVar2].v1 * 2);
  dVar17 = (double)*(int *)((long)&this_00->VertexMap + (long)pFVar7[uVar2].v1 * 0x10 + 4);
  iVar4 = *(int *)(&this_00->VertexMap + (long)pFVar7[uVar2].v2 * 2);
  pFVar15 = pFVar7 + uVar2;
  iVar5 = *(int *)((long)&this_00->VertexMap + (long)pFVar7[uVar2].v2 * 0x10 + 4);
  bVar1 = pFVar7[uVar2].planefront;
  iVar13 = iVar13 + 1;
  lVar10 = (long)iVar13;
  iVar14 = 0;
  do {
    if (iVar11 <= iVar13) {
      return iVar14;
    }
    dVar18 = OutputDegenerateSubsector::bestinit
             [CONCAT71(in_register_00000009,bForward) & 0xffffffff];
    pFVar7 = (this->Segs).Array;
    pFVar8 = (this->Vertices).Array;
    seg = (FPrivSeg *)0x0;
    for (lVar12 = lVar10; lVar12 < iVar11; lVar12 = lVar12 + 1) {
      this_00 = (FNodeBuilder *)((ulong)(this->SegList).Array[lVar12].SegNum * 0x48);
      pFVar15 = (FPrivSeg *)((long)&this_00->VertexMap + (long)pFVar7);
      if ((bool)*(char *)((long)&(this_00->SubsectorSets).Array + (long)&pFVar7->linedef) ==
          (bVar1 != !bForward)) {
        this_00 = (FNodeBuilder *)((long)pFVar15->v1 * 0x10);
        dVar16 = ((double)*(int *)((long)&this_00->VertexMap + (long)&(pFVar8->super_FSimpleVert).y)
                 - dVar17) * ((double)iVar5 - dVar17) +
                 ((double)*(int *)((long)&this_00->VertexMap + (long)pFVar8) - (double)iVar3) *
                 ((double)iVar4 - (double)iVar3);
        if (bForward) {
          if ((dVar16 < dVar18) && (lastdot < dVar16)) {
LAB_003be458:
            seg = pFVar15;
            dVar18 = dVar16;
          }
        }
        else if ((dVar18 < dVar16) && (dVar16 < lastdot)) goto LAB_003be458;
      }
    }
    if (seg != (FPrivSeg *)0x0) {
      if ((*prev)->v2 != seg->v1) {
        PushConnectingGLSeg(this_00,(int)segs,segs,outVerts + (*prev)->v2,outVerts + seg->v1);
        iVar14 = iVar14 + 1;
      }
      this_00 = this;
      DVar9 = PushGLSeg(this,segs,seg,outVerts);
      pFVar15->storedseg = DVar9;
      iVar14 = iVar14 + 1;
      *prev = seg;
      lastdot = dVar18;
    }
    iVar13 = iVar13 + 1;
  } while( true );
}

Assistant:

int FNodeBuilder::OutputDegenerateSubsector (TArray<glseg_t> &segs, int subsector, bool bForward, double lastdot, FPrivSeg *&prev, vertex_t *outVerts)
{
	static const double bestinit[2] = { -DBL_MAX, DBL_MAX };
	FPrivSeg *seg;
	int i, j, first, max, count;
	double dot, x1, y1, dx, dy, dx2, dy2;
	bool wantside;

	first = (DWORD)(size_t)Subsectors[subsector].firstline;
	max = first + Subsectors[subsector].numlines;
	count = 0;

	seg = &Segs[SegList[first].SegNum];
	x1 = Vertices[seg->v1].x;
	y1 = Vertices[seg->v1].y;
	dx = Vertices[seg->v2].x - x1;
	dy = Vertices[seg->v2].y - y1;
	wantside = seg->planefront ^ !bForward;

	for (i = first + 1; i < max; ++i)
	{
		double bestdot = bestinit[bForward];
		FPrivSeg *bestseg = NULL;
		for (j = first + 1; j < max; ++j)
		{
			seg = &Segs[SegList[j].SegNum];
			if (seg->planefront != wantside)
			{
				continue;
			}
			dx2 = Vertices[seg->v1].x - x1;
			dy2 = Vertices[seg->v1].y - y1;
			dot = dx*dx2 + dy*dy2;

			if (bForward)
			{
				if (dot < bestdot && dot > lastdot)
				{
					bestdot = dot;
					bestseg = seg;
				}
			}
			else
			{
				if (dot > bestdot && dot < lastdot)
				{
					bestdot = dot;
					bestseg = seg;
				}
			}
		}
		if (bestseg != NULL)
		{
			if (prev->v2 != bestseg->v1)
			{
				PushConnectingGLSeg (subsector, segs, &outVerts[prev->v2], &outVerts[bestseg->v1]);
				count++;
			}
			seg->storedseg = PushGLSeg (segs, bestseg, outVerts);
			count++;
			prev = bestseg;
			lastdot = bestdot;
		}
	}
	return count;
}